

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Args.cpp
# Opt level: O0

bool idx2::OptVal(int NArgs,cstr *Args,cstr Opt,i64 *V)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  anon_union_8_2_2df48d06_for_stref_0 local_50;
  undefined4 local_48;
  int local_3c;
  i64 *piStack_38;
  int I;
  i64 *V_local;
  cstr Opt_local;
  cstr *Args_local;
  int NArgs_local;
  anon_union_8_2_2df48d06_for_stref_0 *local_10;
  
  local_3c = 1;
  piStack_38 = V;
  V_local = (i64 *)Opt;
  Opt_local = (cstr)Args;
  Args_local._0_4_ = NArgs;
  while( true ) {
    if ((int)Args_local <= local_3c + 1) {
      return false;
    }
    iVar2 = strncmp(*(char **)(Opt_local + (long)local_3c * 8),(char *)V_local,0x20);
    if (iVar2 == 0) break;
    local_3c = local_3c + 1;
  }
  _NArgs_local = (anon_union_8_2_2df48d06_for_stref_0)
                 ((anon_union_8_2_2df48d06_for_stref_0 *)(Opt_local + (long)(local_3c + 1) * 8))->
                 Ptr;
  local_10 = &local_50;
  local_50 = _NArgs_local;
  sVar3 = strlen(_NArgs_local);
  local_48 = (undefined4)sVar3;
  bVar1 = ToInt64((stref *)&local_50,piStack_38);
  return bVar1;
}

Assistant:

bool
OptVal(int NArgs, cstr* Args, cstr Opt, i64* V)
{
  for (int I = 1; I + 1 < NArgs; ++I)
  {
    if (strncmp(Args[I], Opt, 32) == 0)
    {
      return ToInt64(Args[I + 1], V);
    }
  }

  return false;
}